

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebugIfHasDebugStream<QString,_QString> operator<<(QDebug debug,pair<QString,_QString> *pair)

{
  QTextStream *pQVar1;
  Data *pDVar2;
  long in_RDX;
  undefined8 *puVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)pair);
  pQVar1 = (QTextStream *)(pair->first).d.d;
  pQVar1[0x30] = (QTextStream)0x0;
  QVar4.m_data = (storage_type *)0xa;
  QVar4.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar4);
  QTextStream::operator<<(pQVar1,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar1 = (QTextStream *)(pair->first).d.d;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  puVar3 = *(undefined8 **)(in_RDX + 8);
  if (puVar3 == (undefined8 *)0x0) {
    puVar3 = &QString::_empty;
  }
  QDebug::putString((QChar *)pair,(ulong)puVar3);
  pQVar1 = (QTextStream *)(pair->first).d.d;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  pQVar1 = (QTextStream *)(pair->first).d.d;
  QVar5.m_data = (storage_type *)0x2;
  QVar5.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<(pQVar1,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar1 = (QTextStream *)(pair->first).d.d;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  puVar3 = *(undefined8 **)(in_RDX + 0x20);
  if (puVar3 == (undefined8 *)0x0) {
    puVar3 = &QString::_empty;
  }
  QDebug::putString((QChar *)pair,(ulong)puVar3);
  pQVar1 = (QTextStream *)(pair->first).d.d;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  QTextStream::operator<<((QTextStream *)(pair->first).d.d,')');
  pQVar1 = (QTextStream *)(pair->first).d.d;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  pDVar2 = (pair->first).d.d;
  (pair->first).d.d = (Data *)0x0;
  *(Data **)debug.stream = pDVar2;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebugIfHasDebugStream<QString,_QString>)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebugIfHasDebugStream<T1, T2> operator<<(QDebug debug, const std::pair<T1, T2> &pair)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << "std::pair(" << pair.first << ", " << pair.second << ')';
    return debug;
}